

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBSplineCurve::IfcBSplineCurve(IfcBSplineCurve *this,void **vtt)

{
  void **vtt_local;
  IfcBSplineCurve *this_local;
  
  IfcBoundedCurve::IfcBoundedCurve(&this->super_IfcBoundedCurve,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBSplineCurve,_5UL> *)
             &(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40,vtt + 0x17);
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcBoundedCurve).super_IfcCurve.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[0xfffffffffffffffd]) = vtt[0x19];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x1a];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x1b];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             field_0x30 = vtt[0x1c];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = vtt[0x1d];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_2UL,_0UL>::ListOf
            (&this->ControlPointsList);
  std::__cxx11::string::string((string *)&this->CurveForm);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->ClosedCurve);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->SelfIntersect);
  return;
}

Assistant:

IfcBSplineCurve() : Object("IfcBSplineCurve") {}